

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmigaADF.cpp
# Opt level: O0

void (anonymous_namespace)::encode_block<unsigned_char_const*,unsigned_char*>
               (uchar *begin,uchar *end,uchar *first)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte *pbVar5;
  uint8_t source_1;
  byte *pbStack_28;
  uint8_t source;
  uchar *cursor;
  uchar *first_local;
  uchar *end_local;
  uchar *begin_local;
  
  pbStack_28 = begin;
  cursor = first;
  while (pbVar5 = begin, pbStack_28 != end) {
    bVar1 = *pbStack_28;
    bVar2 = *pbStack_28;
    bVar3 = *pbStack_28;
    bVar4 = *pbStack_28;
    pbVar5 = pbStack_28 + 1;
    pbStack_28 = pbStack_28 + 2;
    *cursor = (bVar1 & 2) << 3 | (bVar2 & 8) << 2 | (bVar3 & 0x20) << 1 | bVar4 & 0x80 |
              (byte)((int)(*pbVar5 & 2) >> 1) | (byte)((int)(*pbVar5 & 8) >> 2) |
              (byte)((int)(*pbVar5 & 0x20) >> 3) | (byte)((int)(*pbVar5 & 0x80) >> 4);
    cursor = cursor + 1;
  }
  while (pbStack_28 = pbVar5, pbStack_28 != end) {
    pbVar5 = pbStack_28 + 1;
    *cursor = (*pbStack_28 & 1) << 4 | (*pbStack_28 & 4) << 3 | (*pbStack_28 & 0x10) << 2 |
              (*pbStack_28 & 0x40) << 1 |
              *pbVar5 & 1 | (byte)((int)(*pbVar5 & 4) >> 1) | (byte)((int)(*pbVar5 & 0x10) >> 2) |
              (byte)((int)(*pbVar5 & 0x40) >> 3);
    cursor = cursor + 1;
    pbVar5 = pbStack_28 + 2;
  }
  return;
}

Assistant:

void encode_block(IteratorT begin, IteratorT end, OutputIt first) {
	// Parse 1: combine odd bits.
	auto cursor = begin;
	while(cursor != end) {
		auto source = uint8_t(
			((*cursor & 0x02) << 3) |
			((*cursor & 0x08) << 2) |
			((*cursor & 0x20) << 1) |
			((*cursor & 0x80) << 0)
		);
		++cursor;
		source |=
			((*cursor & 0x02) >> 1) |
			((*cursor & 0x08) >> 2) |
			((*cursor & 0x20) >> 3) |
			((*cursor & 0x80) >> 4);
		++cursor;

		*first = source;
		++first;
	}

	// Parse 2: combine even bits.
	cursor = begin;
	while(cursor != end) {
		auto source = uint8_t(
			((*cursor & 0x01) << 4) |
			((*cursor & 0x04) << 3) |
			((*cursor & 0x10) << 2) |
			((*cursor & 0x40) << 1)
		);
		++cursor;
		source |=
			((*cursor & 0x01) >> 0) |
			((*cursor & 0x04) >> 1) |
			((*cursor & 0x10) >> 2) |
			((*cursor & 0x40) >> 3);
		++cursor;

		*first = source;
		++first;
	}
}